

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O3

void __thiscall commodities_customShort_Test::TestBody(commodities_customShort_Test *this)

{
  char *pcVar1;
  string ss;
  uint32_t in_stack_fffffffffffffedc;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  internal local_118;
  undefined7 uStack_117;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  long local_108 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  units::disableCustomCommodities();
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"QQQQ","");
  units::getCommodity(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  units::getCommodityName_abi_cxx11_(in_stack_fffffffffffffedc);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (&local_118,"ss","\"qqqq\"",&local_f8,(char (*) [5])"qqqq");
  if (local_118 == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0x52,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffed8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed8);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"a","");
  units::getCommodity(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  units::getCommodityName_abi_cxx11_(in_stack_fffffffffffffedc);
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_118);
  if ((long *)CONCAT71(uStack_117,local_118) != local_108) {
    operator_delete((long *)CONCAT71(uStack_117,local_118),local_108[0] + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            (&local_118,"ss","\"a\"",&local_f8,(char (*) [2])0x17820b);
  if (local_118 == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0x56,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffed8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed8);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"bb","");
  units::getCommodity(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  units::getCommodityName_abi_cxx11_(in_stack_fffffffffffffedc);
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_118);
  if ((long *)CONCAT71(uStack_117,local_118) != local_108) {
    operator_delete((long *)CONCAT71(uStack_117,local_118),local_108[0] + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            (&local_118,"ss","\"bb\"",&local_f8,(char (*) [3])"bb");
  if (local_118 == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0x5a,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffed8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed8);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ccc","");
  units::getCommodity(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  units::getCommodityName_abi_cxx11_(in_stack_fffffffffffffedc);
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_118);
  if ((long *)CONCAT71(uStack_117,local_118) != local_108) {
    operator_delete((long *)CONCAT71(uStack_117,local_118),local_108[0] + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (&local_118,"ss","\"ccc\"",&local_f8,(char (*) [4])"ccc");
  if (local_118 == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0x5e,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffed8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed8);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ddddd","");
  units::getCommodity(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  units::getCommodityName_abi_cxx11_(in_stack_fffffffffffffedc);
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_118);
  if ((long *)CONCAT71(uStack_117,local_118) != local_108) {
    operator_delete((long *)CONCAT71(uStack_117,local_118),local_108[0] + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            (&local_118,"ss","\"ddddd\"",&local_f8,(char (*) [6])"ddddd");
  if (local_118 == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0x62,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffed8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed8);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"eeeeee","");
  units::getCommodity(&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  units::getCommodityName_abi_cxx11_(in_stack_fffffffffffffedc);
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_118);
  if ((long *)CONCAT71(uStack_117,local_118) != local_108) {
    operator_delete((long *)CONCAT71(uStack_117,local_118),local_108[0] + 1);
  }
  testing::internal::CmpHelperNE<std::__cxx11::string,char[7]>
            (&local_118,"ss","\"eeeeee\"",&local_f8,(char (*) [7])"eeeeee");
  if (local_118 == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0x67,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffed8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed8);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  units::enableCustomCommodities();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(commodities, customShort)
{
    disableCustomCommodities();
    auto c = getCommodity("QQQQ");
    auto ss = getCommodityName(c);
    EXPECT_EQ(ss, "qqqq");

    c = getCommodity("a");
    ss = getCommodityName(c);
    EXPECT_EQ(ss, "a");

    c = getCommodity("bb");
    ss = getCommodityName(c);
    EXPECT_EQ(ss, "bb");

    c = getCommodity("ccc");
    ss = getCommodityName(c);
    EXPECT_EQ(ss, "ccc");

    c = getCommodity("ddddd");
    ss = getCommodityName(c);
    EXPECT_EQ(ss, "ddddd");

    // this one should fail
    c = getCommodity("eeeeee");
    ss = getCommodityName(c);
    EXPECT_NE(ss, "eeeeee");
    enableCustomCommodities();
}